

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)

{
  size_t num;
  size_t sockets;
  _Bool _Var1;
  uint32_t uVar2;
  fnet_socket_t *es;
  size_t i;
  ulong uVar3;
  fnet_socket_t *rs;
  fnet_socket_t afStack_f0 [2];
  size_t sStack_e8;
  fnet_socket_t afStack_e0 [2];
  undefined1 local_d8 [8];
  fnet_address_t broadcast_addr;
  size_t local_48;
  size_t es_num;
  size_t rs_num;
  
  afStack_e0[0] = 0x104bf6;
  afStack_e0[1] = 0;
  _Var1 = fnet_str2addr("255.255.255.255:9999",(fnet_address_t *)local_d8);
  if (_Var1) {
    broadcast_addr.__ss_align._0_4_ = 0x4f4c4548;
    stack0xffffffffffffffac = *(undefined8 *)svc->sn;
    rs_num = (size_t)svc->ifaces;
    afStack_e0[0] = 0x10;
    afStack_e0[1] = 0;
    for (uVar3 = 0; sockets = rs_num, uVar3 < svc->ifaces_num; uVar3 = uVar3 + 1) {
      afStack_e0[0] = 0x104c51;
      afStack_e0[1] = 0;
      fnet_socket_sendto(svc->ifaces[uVar3],(char *)&broadcast_addr.__ss_align,0x10,
                         (fnet_address_t *)local_d8);
    }
    rs = (fnet_socket_t *)(local_d8 + -(svc->ifaces_num * 4 + 0xf & 0xfffffffffffffff0));
    num = svc->ifaces_num;
    es = (fnet_socket_t *)((long)rs - (num * 4 + 0xf & 0xfffffffffffffff0));
    es_num = 0;
    local_48 = 0;
    es[-4] = 1000;
    es[-3] = 0;
    es[-6] = 0x104caf;
    es[-5] = 0;
    _Var1 = fnet_socket_select((fnet_socket_t *)sockets,num,rs,&es_num,es,&local_48,
                               *(size_t *)(es + -4));
    if ((_Var1) && (es_num != 0)) {
      svc->socket = *rs;
      es[-2] = 0x104cca;
      es[-1] = 0;
      uVar2 = fnode_service_recv_cmd(svc);
      if (uVar2 == 0x464e4f43) {
        es[-2] = 2;
        es[-1] = 0;
        return (fnode_service_state_t)*(undefined8 *)(es + -2);
      }
    }
  }
  return FSVC_INIT;
}

Assistant:

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)
{
    // get broadcast address
    fnet_address_t broadcast_addr;
    if (!fnet_str2addr(FNODE_BROADCAST_ADDR, &broadcast_addr))
    {
        FLOG_ERR("Invalid broadcast address");
        return FSVC_INIT;
    }

    // prepare command buffer
    fcmd_hello cmd = {{ FCMD_CHARS(FCMD_HELO) }};
    memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
    memcpy(cmd.dev_type, svc->dev_type, sizeof svc->dev_type);

    // broadcast hello message to each interface
    for(size_t i = 0; i < svc->ifaces_num; ++i)
        fnet_socket_sendto(svc->ifaces[i], (const char *)&cmd, sizeof cmd, &broadcast_addr);

    fnet_socket_t rs[svc->ifaces_num], es[svc->ifaces_num];
    size_t rs_num = 0, es_num = 0;
    if (fnet_socket_select(svc->ifaces, svc->ifaces_num, rs, &rs_num, es, &es_num, FNODE_HELLO_FREQ) && rs_num)
    {
        if (rs_num)
            svc->socket = rs[0];
        if (fnode_service_recv_cmd(svc) == FCMD_CONF)
            return FSVC_NOTIFY_STATUS;
    }

    return FSVC_INIT;
}